

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O0

void __thiscall
ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader
          (TrackFileWriter<ASDCP::MXF::OP1aHeader> *this,MXFVersion *mxf_ver,
          vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *conformsToSpecifications)

{
  pointer *this_00;
  Preface *this_01;
  size_type sVar1;
  Batch<ASDCP::UL> *pBVar2;
  byte_t *value;
  Identification *this_02;
  char *pcVar3;
  reference pvVar4;
  undefined1 local_b0 [8];
  vector<int,_std::allocator<int>_> version;
  Identification *Ident;
  UL local_60;
  UL *local_40;
  __normal_iterator<const_ASDCP::UL_*,_std::vector<ASDCP::UL,_std::allocator<ASDCP::UL>_>_> local_38
  ;
  vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *local_20;
  vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *conformsToSpecifications_local;
  MXFVersion *mxf_ver_local;
  TrackFileWriter<ASDCP::MXF::OP1aHeader> *this_local;
  
  local_20 = conformsToSpecifications;
  conformsToSpecifications_local = (vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *)mxf_ver;
  mxf_ver_local = (MXFVersion *)this;
  if (this->m_Dict == (Dictionary *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x285,
                  "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                 );
  }
  if (this->m_EssenceDescriptor != (FileDescriptor *)0x0) {
    Primer::ClearTagList(&(this->m_HeaderPart).m_Primer);
    this_01 = (Preface *)operator_new(0x260);
    Preface::Preface(this_01,this->m_Dict);
    (this->m_HeaderPart).m_Preface = this_01;
    Partition::AddChildObject
              (&(this->m_HeaderPart).super_Partition,
               &((this->m_HeaderPart).m_Preface)->super_InterchangeObject);
    if (local_20 != (vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *)0x0) {
      sVar1 = std::vector<ASDCP::UL,_std::allocator<ASDCP::UL>_>::size(local_20);
      if (sVar1 != 0) {
        optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::set_has_value
                  (&((this->m_HeaderPart).m_Preface)->ConformsToSpecifications,true);
        pBVar2 = optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::get
                           (&((this->m_HeaderPart).m_Preface)->ConformsToSpecifications);
        local_38._M_current =
             (UL *)std::vector<ASDCP::UL,_std::allocator<ASDCP::UL>_>::begin(local_20);
        local_40 = (UL *)std::vector<ASDCP::UL,_std::allocator<ASDCP::UL>_>::end(local_20);
        std::set<ASDCP::UL,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>::
        insert<__gnu_cxx::__normal_iterator<ASDCP::UL_const*,std::vector<ASDCP::UL,std::allocator<ASDCP::UL>>>>
                  ((set<ASDCP::UL,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>> *)
                   &(pBVar2->super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>).
                    super_PushSet<ASDCP::UL>.
                    super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>,local_38,
                   (__normal_iterator<const_ASDCP::UL_*,_std::vector<ASDCP::UL,_std::allocator<ASDCP::UL>_>_>
                    )local_40);
      }
    }
    value = Dictionary::ul(this->m_Dict,MDD_OP1a);
    UL::UL(&local_60,value);
    UL::operator=(&((this->m_HeaderPart).m_Preface)->OperationalPattern,&local_60);
    UL::~UL(&local_60);
    UL::operator=(&(this->m_HeaderPart).super_Partition.OperationalPattern,
                  &((this->m_HeaderPart).m_Preface)->OperationalPattern);
    if (*(int *)conformsToSpecifications_local == 0) {
      (this->m_HeaderPart).super_Partition.MinorVersion = 2;
      ((this->m_HeaderPart).m_Preface)->Version = 0x102;
      Ident._4_4_ = 1;
      optional_property<unsigned_int>::operator=
                (&((this->m_HeaderPart).m_Preface)->ObjectModelVersion,(uint *)((long)&Ident + 4));
    }
    else {
      if (*(int *)conformsToSpecifications_local != 1) {
        __assert_fail("mxf_ver == MXFVersion_2011",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                      ,0x2a5,
                      "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                     );
      }
      (this->m_HeaderPart).super_Partition.MinorVersion = 3;
      ((this->m_HeaderPart).m_Preface)->Version = 0x103;
      Ident._0_4_ = 1;
      optional_property<unsigned_int>::operator=
                (&((this->m_HeaderPart).m_Preface)->ObjectModelVersion,(uint *)&Ident);
    }
    this_02 = (Identification *)operator_new(0x1d0);
    Identification::Identification(this_02,this->m_Dict);
    Partition::AddChildObject(&(this->m_HeaderPart).super_Partition,(InterchangeObject *)this_02);
    std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
              (&(((this->m_HeaderPart).m_Preface)->Identifications).
                super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                .super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>,
               &(this_02->super_InterchangeObject).InstanceUID);
    Kumu::GenRandomValue(&this_02->ThisGenerationUID);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    UTF16String::operator=(&this_02->CompanyName,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    UTF16String::operator=(&this_02->ProductName,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    UTF16String::operator=(&this_02->VersionString,pcVar3);
    Kumu::Identifier<16U>::Set
              (&(this_02->ProductUID).super_Identifier<16U>,(this->m_Info).ProductUUID);
    this_00 = &version.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
    UTF16String::UTF16String((UTF16String *)this_00,"unix");
    optional_property<ASDCP::MXF::UTF16String>::operator=(&this_02->Platform,(UTF16String *)this_00)
    ;
    UTF16String::~UTF16String
              ((UTF16String *)
               &version.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pcVar3 = Version();
    version_split((vector<int,_std::allocator<int>_> *)local_b0,pcVar3);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_b0,0);
    (this_02->ToolkitVersion).Major = (ui16_t)*pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_b0,1);
    (this_02->ToolkitVersion).Minor = (ui16_t)*pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_b0,2);
    (this_02->ToolkitVersion).Patch = (ui16_t)*pvVar4;
    (this_02->ToolkitVersion).Build = 0x6a68;
    (this_02->ToolkitVersion).Release = RL_RELEASE;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b0);
    return;
  }
  __assert_fail("m_EssenceDescriptor",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                ,0x286,
                "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
               );
}

Assistant:

void InitHeader(const MXFVersion& mxf_ver, const std::vector<ASDCP::UL>* conformsToSpecifications = NULL)
	{
	  assert(m_Dict);
	  assert(m_EssenceDescriptor);
 
	  m_HeaderPart.m_Primer.ClearTagList();
	  m_HeaderPart.m_Preface = new Preface(m_Dict);
	  m_HeaderPart.AddChildObject(m_HeaderPart.m_Preface);

		// add conformsToSpecifications, if it exists

		if (conformsToSpecifications && conformsToSpecifications->size() > 0) {

			m_HeaderPart.m_Preface->ConformsToSpecifications.set_has_value();

			m_HeaderPart.m_Preface->ConformsToSpecifications.get().insert(
				conformsToSpecifications->begin(),
				conformsToSpecifications->end()
			);
		}

	  // Set the Operational Pattern label -- we're just starting and have no RIP or index,
	  // so we tell the world by using OP1a
	  m_HeaderPart.m_Preface->OperationalPattern = UL(m_Dict->ul(MDD_OP1a));
	  m_HeaderPart.OperationalPattern = m_HeaderPart.m_Preface->OperationalPattern;

	  if ( mxf_ver == MXFVersion_2004 )
	    {
	      m_HeaderPart.MinorVersion = MXF_2004_MinorVersion;
	      m_HeaderPart.m_Preface->Version = ((MXF_ObjectModelVersion << 8) | MXF_2004_MinorVersion);
	      m_HeaderPart.m_Preface->ObjectModelVersion = MXF_ObjectModelVersion;
	    }
	  else
	    {
	      assert(mxf_ver == MXFVersion_2011);
	      m_HeaderPart.MinorVersion = MXF_2011_MinorVersion;
	      m_HeaderPart.m_Preface->Version = ((MXF_ObjectModelVersion << 8) | MXF_2011_MinorVersion);
	      m_HeaderPart.m_Preface->ObjectModelVersion = MXF_ObjectModelVersion;
	    }

	  // Identification
	  Identification* Ident = new Identification(m_Dict);
	  m_HeaderPart.AddChildObject(Ident);
	  m_HeaderPart.m_Preface->Identifications.push_back(Ident->InstanceUID);

	  Kumu::GenRandomValue(Ident->ThisGenerationUID);
	  Ident->CompanyName = m_Info.CompanyName.c_str();
	  Ident->ProductName = m_Info.ProductName.c_str();
	  Ident->VersionString = m_Info.ProductVersion.c_str();
	  Ident->ProductUID.Set(m_Info.ProductUUID);
	  Ident->Platform = ASDCP_PLATFORM;

	  std::vector<int> version = version_split(Version());

	  Ident->ToolkitVersion.Major = version[0];
	  Ident->ToolkitVersion.Minor = version[1];
	  Ident->ToolkitVersion.Patch = version[2];
	  Ident->ToolkitVersion.Build = ASDCP_BUILD_NUMBER;
	  Ident->ToolkitVersion.Release = VersionType::RL_RELEASE;
	}